

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_ManSolve2(Cbs_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pObj2)

{
  int iVar1;
  int local_24;
  int RetValue;
  Gia_Obj_t *pObj2_local;
  Gia_Obj_t *pObj_local;
  Cbs_Man_t *p_local;
  
  local_24 = 0;
  s_Counter = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3ce,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3cf,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3d0,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  (p->Pars).nBTThisNc = 0;
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  Cbs_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  if (pObj2 != (Gia_Obj_t *)0x0) {
    Cbs_ManAssign(p,pObj2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  }
  iVar1 = Cbs_ManSolve_rec(p,0);
  if (iVar1 == 0) {
    iVar1 = Cbs_ManCheckLimits(p);
    if (iVar1 == 0) {
      Cbs_ManSaveModelAll(p,p->vModel);
      goto LAB_009208d5;
    }
  }
  local_24 = 1;
LAB_009208d5:
  Cbs_ManCancelUntil(p,0);
  (p->pJust).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pClauses).iTail = 1;
  (p->pClauses).iHead = 1;
  (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
  iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
  (p->Pars).nJustTotal = iVar1;
  iVar1 = Cbs_ManCheckLimits(p);
  if (iVar1 != 0) {
    local_24 = -1;
  }
  return local_24;
}

Assistant:

int Cbs_ManSolve2( Cbs_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pObj2 )
{
    int RetValue = 0;
    s_Counter = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs_ManAssign( p, pObj, 0, NULL, NULL );
    if ( pObj2 ) 
    Cbs_ManAssign( p, pObj2, 0, NULL, NULL );
    if ( !Cbs_ManSolve_rec(p, 0) && !Cbs_ManCheckLimits(p) )
        Cbs_ManSaveModelAll( p, p->vModel );
    else
        RetValue = 1;
    Cbs_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "%d ", s_Counter );
    return RetValue;
}